

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_lnkasi(runtime_type *this,iterator a,var *b)

{
  int iVar1;
  signal_types sVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  proxy *in_RDI;
  token_base *in_stack_00000098;
  var *in_stack_000000a0;
  runtime_type *in_stack_000000a8;
  var *in_stack_000000b0;
  runtime_type *in_stack_000000b8;
  token_base *token;
  undefined1 in_stack_000007ff;
  iterator *in_stack_00000800;
  runtime_type *in_stack_00000808;
  string *in_stack_fffffffffffffeb8;
  runtime_error *in_stack_fffffffffffffec0;
  var *in_stack_fffffffffffffec8;
  allocator *paVar5;
  var *in_stack_fffffffffffffed0;
  runtime_type *in_stack_fffffffffffffed8;
  iterator *in_stack_ffffffffffffff00;
  iterator *in_stack_ffffffffffffff08;
  iterator *this_01;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  allocator in_stack_ffffffffffffff47;
  domain_manager *in_stack_ffffffffffffff48;
  allocator local_91;
  string local_90 [32];
  tree_node *local_70;
  tree_node *local_60;
  tree_node *local_40;
  tree_node *local_38;
  token_id *local_28;
  iterator local_10 [2];
  
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff00);
  local_28 = (token_id *)*pptVar3;
  iVar1 = (*(local_28->super_token_base)._vptr_token_base[2])();
  if (iVar1 == 4) {
    token_id::get_id(local_28);
    domain_manager::get_var
              (in_stack_ffffffffffffff48,
               (var_id *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    parse_lnkasi(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    iVar1 = (*(local_28->super_token_base)._vptr_token_base[2])();
    if (iVar1 != 3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar5 = (allocator *)&stack0xffffffffffffff47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff48,
                 "Unexpected left operand in link assign expression.",paVar5);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffeb8);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    sVar2 = token_signal::get_signal((token_signal *)local_28);
    if (sVar2 == dot_) {
      this_01 = local_10;
      local_38 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(this_01);
      parse_expr(in_stack_00000808,in_stack_00000800,(bool)in_stack_000007ff);
      local_40 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(this_01);
      tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff00);
      parse_dot_lhs(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
      parse_lnkasi(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      cs_impl::any::~any((any *)0x51867c);
    }
    else {
      if (sVar2 != access_) {
        uVar4 = __cxa_allocate_exception(0x28);
        paVar5 = &local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_90,"Unexpected left operand in link assign expression.",paVar5);
        runtime_error::runtime_error(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_60 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(in_stack_ffffffffffffff08)
      ;
      parse_expr(in_stack_00000808,in_stack_00000800,(bool)in_stack_000007ff);
      local_70 = (tree_node *)
                 tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffff08);
      parse_expr(in_stack_00000808,in_stack_00000800,(bool)in_stack_000007ff);
      parse_access_lhs(in_stack_000000b8,in_stack_000000b0,(var *)in_stack_000000a8);
      parse_lnkasi(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      cs_impl::any::~any((any *)0x518771);
      cs_impl::any::~any((any *)0x51877e);
    }
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_lnkasi(tree_type<token_base *>::iterator a, const var &b)
	{
		token_base *token = a.data();
		if (token->get_type() == token_types::id)
			return parse_lnkasi(storage.get_var(static_cast<token_id *>(token)->get_id()), b);
		else if (token->get_type() == token_types::signal) {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			case signal_types::dot_:
				return parse_lnkasi(parse_dot_lhs(parse_expr(a.left()), a.right().data()), b);
			case signal_types::access_:
				return parse_lnkasi(parse_access_lhs(parse_expr(a.left()), parse_expr(a.right())), b);
			default:
				throw runtime_error("Unexpected left operand in link assign expression.");
			}
		}
		else
			throw runtime_error("Unexpected left operand in link assign expression.");
	}